

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O2

void do_room_or_subroom(level *lev,mkroom *croom,int lowx,int lowy,int hix,int hiy,boolean lit,
                       schar rtype,boolean special,boolean is_room)

{
  uint uVar1;
  uint uVar2;
  int x2;
  int y1;
  int x1;
  int iVar3;
  long lVar4;
  schar *psVar5;
  int y2;
  long lVar6;
  long lVar7;
  undefined1 *puVar8;
  ulong uVar9;
  undefined1 *puVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  schar *psVar15;
  long lVar16;
  
  x1 = lowx + (uint)(lowx == 0);
  y1 = lowy + (uint)(lowy == 0);
  x2 = 0x4e;
  if (hix < 0x4e) {
    x2 = hix;
  }
  y2 = 0x13;
  if (hiy < 0x13) {
    y2 = hiy;
  }
  uVar9 = 0;
  if (lit != '\0') {
    uVar1 = y1 - 1;
    if (0 < (int)uVar1) {
      uVar9 = (ulong)uVar1;
    }
    lVar12 = (long)(x1 + -1);
    puVar8 = &lev->locations[lVar12][uVar9].field_0x6;
    for (; puVar10 = puVar8, uVar2 = uVar1, lVar12 <= x2 + 1; lVar12 = lVar12 + 1) {
      for (; (int)uVar2 <= y2 + 1; uVar2 = uVar2 + 1) {
        puVar10[1] = puVar10[1] | 4;
        puVar10 = puVar10 + 0xc;
      }
      puVar8 = puVar8 + 0xfc;
    }
    uVar9 = 1;
  }
  croom->rlit = (schar)uVar9;
  croom->lx = (schar)x1;
  croom->hx = (schar)x2;
  croom->ly = (schar)y1;
  croom->hy = (schar)y2;
  croom->rtype = rtype;
  croom->doorct = '\0';
  croom->fdoor = (schar)lev->doorindex;
  croom->nsubrooms = '\0';
  croom->irregular = '\0';
  croom->sbrooms[0] = (mkroom *)0x0;
  if (special == '\0') {
    lVar4 = (long)(y1 + -1);
    lVar13 = (long)((y2 - y1) + 2);
    lVar6 = (long)(y2 + 1);
    lVar11 = (long)(x1 + -1);
    lVar7 = (long)(x2 + 1);
    puVar8 = &lev->locations[lVar11][lVar4].field_0x6;
    for (lVar12 = lVar11; puVar10 = puVar8, lVar16 = lVar4, lVar12 <= lVar7; lVar12 = lVar12 + 1) {
      for (; lVar16 <= lVar6; lVar16 = lVar16 + lVar13) {
        puVar10[-2] = '\x02';
        puVar10[1] = puVar10[1] | 2;
        puVar10 = puVar10 + lVar13 * 0xc;
      }
      puVar8 = puVar8 + 0xfc;
    }
    lVar13 = (long)y1;
    lVar16 = (long)((x2 - x1) + 2);
    puVar8 = &lev->locations[lVar11][lVar13].field_0x6;
    for (lVar12 = lVar11; puVar10 = puVar8, lVar14 = lVar13, lVar12 <= lVar7;
        lVar12 = lVar12 + lVar16) {
      for (; lVar14 <= y2; lVar14 = lVar14 + 1) {
        puVar10[-2] = '\x01';
        puVar10[1] = puVar10[1] & 0xfd;
        puVar10 = puVar10 + 0xc;
      }
      puVar8 = puVar8 + lVar16 * 0xfc;
    }
    lVar12 = (long)x1;
    psVar5 = &lev->locations[lVar12][lVar13].typ;
    for (; psVar15 = psVar5, iVar3 = y1, lVar12 <= x2; lVar12 = lVar12 + 1) {
      for (; iVar3 <= y2; iVar3 = iVar3 + 1) {
        *psVar15 = '\x19';
        psVar15 = psVar15 + 0xc;
      }
      psVar5 = psVar5 + 0xfc;
    }
    if (is_room != '\0') {
      lev->locations[lVar11][lVar4].typ = '\x03';
      lev->locations[lVar7][lVar4].typ = '\x04';
      lev->locations[lVar11][lVar6].typ = '\x05';
      lev->locations[lVar7][lVar6].typ = '\x06';
      y2 = y2 + 1;
      x1 = x1 + -1;
      y1 = y1 + -1;
      x2 = x2 + 1;
    }
    wallification(lev,x1,y1,x2,y2);
    return;
  }
  return;
}

Assistant:

static void do_room_or_subroom(struct level *lev,
			       struct mkroom *croom,
			       int lowx, int lowy,
			       int hix, int hiy,
			       boolean lit,
			       schar rtype,
			       boolean special,
			       boolean is_room)
{
	int x, y;
	struct rm *loc;

	/* locations might bump level edges in wall-less rooms */
	/* add/subtract 1 to allow for edge locations */
	if (!lowx) lowx++;
	if (!lowy) lowy++;
	if (hix >= COLNO-1) hix = COLNO-2;
	if (hiy >= ROWNO-1) hiy = ROWNO-2;

	if (lit) {
		for (x = lowx-1; x <= hix+1; x++) {
			loc = &lev->locations[x][max(lowy-1,0)];
			for (y = lowy-1; y <= hiy+1; y++)
				loc++->lit = 1;
		}
		croom->rlit = 1;
	} else
		croom->rlit = 0;

	croom->lx = lowx;
	croom->hx = hix;
	croom->ly = lowy;
	croom->hy = hiy;
	croom->rtype = rtype;
	croom->doorct = 0;
	/* if we're not making a vault, lev->doorindex will still be 0
	 * if we are, we'll have problems adding niches to the previous room
	 * unless fdoor is at least doorindex
	 */
	croom->fdoor = lev->doorindex;
	croom->irregular = FALSE;

	croom->nsubrooms = 0;
	croom->sbrooms[0] = NULL;
	if (!special) {
	    for (x = lowx-1; x <= hix+1; x++)
		for (y = lowy-1; y <= hiy+1; y += (hiy-lowy+2)) {
		    lev->locations[x][y].typ = HWALL;
		    lev->locations[x][y].horizontal = 1;	/* For open/secret doors. */
		}
	    for (x = lowx-1; x <= hix+1; x += (hix-lowx+2))
		for (y = lowy; y <= hiy; y++) {
		    lev->locations[x][y].typ = VWALL;
		    lev->locations[x][y].horizontal = 0;	/* For open/secret doors. */
		}
	    for (x = lowx; x <= hix; x++) {
		loc = &lev->locations[x][lowy];
		for (y = lowy; y <= hiy; y++)
		    loc++->typ = ROOM;
	    }
	    if (is_room) {
		lev->locations[lowx-1][lowy-1].typ = TLCORNER;
		lev->locations[hix+1][lowy-1].typ = TRCORNER;
		lev->locations[lowx-1][hiy+1].typ = BLCORNER;
		lev->locations[hix+1][hiy+1].typ = BRCORNER;
		wallification(lev, lowx-1, lowy-1, hix+1, hiy+1);
	    } else {	/* a subroom */
		wallification(lev, lowx, lowy, hix, hiy);	/* this is bugs */
	    }
	}
}